

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absPth.c
# Opt level: O0

int Pdr_ManSolve_test(Aig_Man_t *pAig,Pdr_Par_t *pPars,Abc_Cex_t **ppCex)

{
  int iVar1;
  void *__ptr;
  char *p;
  Abc_Cex_t **ppCex_local;
  Pdr_Par_t *pPars_local;
  Aig_Man_t *pAig_local;
  
  __ptr = malloc(0x6f);
  do {
    do {
    } while (pPars->pFuncStop == (_func_int_int *)0x0);
    iVar1 = (*pPars->pFuncStop)(pPars->RunId);
  } while (iVar1 == 0);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return -1;
}

Assistant:

int Pdr_ManSolve_test( Aig_Man_t * pAig, Pdr_Par_t * pPars, Abc_Cex_t ** ppCex )
{
    char * p = ABC_ALLOC( char, 111 );
    while ( 1 )
    {
        if ( pPars->pFuncStop && pPars->pFuncStop(pPars->RunId) )
            break;
    }
    ABC_FREE( p );
    return -1;
}